

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_tiff
          (CImg<unsigned_char> *this,char *filename,uint first_frame,uint last_frame,uint step_frame
          ,float *voxel_size,CImg<char> *description)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  CImgArgumentException *pCVar6;
  char *pcVar7;
  char *pcVar8;
  CImg<unsigned_char> *pCVar9;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint nlast_frame;
  uint nstep_frame;
  uint nfirst_frame;
  float *local_38;
  float *voxel_size_local;
  uint local_28;
  uint step_frame_local;
  uint last_frame_local;
  uint first_frame_local;
  char *filename_local;
  CImg<unsigned_char> *this_local;
  
  local_38 = voxel_size;
  voxel_size_local._4_4_ = step_frame;
  local_28 = last_frame;
  step_frame_local = first_frame;
  _last_frame_local = filename;
  filename_local = (char *)this;
  if (filename == (char *)0x0) {
    pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar7 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (pCVar6,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_tiff(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
    __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_8c = last_frame;
  if (first_frame < last_frame) {
    local_8c = first_frame;
  }
  local_90 = step_frame;
  if (step_frame == 0) {
    local_90 = 1;
  }
  local_94 = first_frame;
  if (first_frame < last_frame) {
    local_94 = last_frame;
  }
  cimg::unused<float*>(&local_38,description);
  if (((local_8c == 0) && (local_94 == 0xffffffff)) && (local_90 < 2)) {
    pCVar9 = load_other(this,_last_frame_local);
    return pCVar9;
  }
  pCVar6 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  puVar5 = this->_data;
  pcVar7 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgArgumentException::CImgArgumentException
            (pCVar6,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_tiff(): Unable to read sub-images from file \'%s\' unless libtiff is enabled."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,
             _last_frame_local);
  __cxa_throw(pCVar6,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException)
  ;
}

Assistant:

CImg<T>& load_tiff(const char *const filename,
		       const unsigned int first_frame=0, const unsigned int last_frame=~0U,
		       const unsigned int step_frame=1,
                       float *const voxel_size=0,
                       CImg<charT> *const description=0) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_tiff(): Specified filename is (null).",
                                    cimg_instance);

      const unsigned int
	nfirst_frame = first_frame<last_frame?first_frame:last_frame,
	nstep_frame = step_frame?step_frame:1;
      unsigned int nlast_frame = first_frame<last_frame?last_frame:first_frame;

#ifndef cimg_use_tiff
      cimg::unused(voxel_size,description);
      if (nfirst_frame || nlast_frame!=~0U || nstep_frame>1)
        throw CImgArgumentException(_cimg_instance
                                    "load_tiff(): Unable to read sub-images from file '%s' unless libtiff is enabled.",
                                    cimg_instance,
                                    filename);
      return load_other(filename);
#else
#if cimg_verbosity<3
      TIFFSetWarningHandler(0);
      TIFFSetErrorHandler(0);
#endif
      TIFF *tif = TIFFOpen(filename,"r");
      if (tif) {
        unsigned int nb_images = 0;
        do ++nb_images; while (TIFFReadDirectory(tif));
        if (nfirst_frame>=nb_images || (nlast_frame!=~0U && nlast_frame>=nb_images))
          cimg::warn(_cimg_instance
                     "load_tiff(): File '%s' contains %u image(s) while specified frame range is [%u,%u] (step %u).",
                     cimg_instance,
                     filename,nb_images,nfirst_frame,nlast_frame,nstep_frame);

        if (nfirst_frame>=nb_images) return assign();
        if (nlast_frame>=nb_images) nlast_frame = nb_images - 1;
        TIFFSetDirectory(tif,0);
        CImg<T> frame;
        for (unsigned int l = nfirst_frame; l<=nlast_frame; l+=nstep_frame) {
          frame._load_tiff(tif,l,voxel_size,description);
          if (l==nfirst_frame)
            assign(frame._width,frame._height,1 + (nlast_frame - nfirst_frame)/nstep_frame,frame._spectrum);
          if (frame._width>_width || frame._height>_height || frame._spectrum>_spectrum)
            resize(std::max(frame._width,_width),
                   std::max(frame._height,_height),-100,
                   std::max(frame._spectrum,_spectrum),0);
          draw_image(0,0,(l - nfirst_frame)/nstep_frame,frame);
        }
        TIFFClose(tif);
      } else throw CImgIOException(_cimg_instance
                                   "load_tiff(): Failed to open file '%s'.",
                                   cimg_instance,
                                   filename);
      return *this;
#endif
    }